

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::generate_struct(t_rs_generator *this,t_struct *tstruct)

{
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  string local_38;
  t_struct *local_18;
  t_struct *tstruct_local;
  t_rs_generator *this_local;
  
  local_18 = tstruct;
  tstruct_local = (t_struct *)this;
  bVar1 = t_struct::is_union(tstruct);
  if (bVar1) {
    render_union(this,local_18);
  }
  else {
    uVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if ((uVar2 & 1) == 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "cannot generate struct for exception";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    rust_struct_name_abi_cxx11_(&local_38,this,local_18);
    render_struct(this,&local_38,local_18,T_REGULAR);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void t_rs_generator::generate_struct(t_struct* tstruct) {
  if (tstruct->is_union()) {
    render_union(tstruct);
  } else if (tstruct->is_struct()) {
    render_struct(rust_struct_name(tstruct), tstruct, t_rs_generator::T_REGULAR);
  } else {
    throw "cannot generate struct for exception";
  }
}